

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendVersion
          (V2TransportTester *this,Span<const_unsigned_char> version_data,bool vers_ignore)

{
  pointer puVar1;
  pointer puVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> aad;
  
  puVar2 = (this->m_sent_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_sent_garbage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + -(long)puVar2;
  if (this->m_sent_aad != false) {
    puVar2 = (pointer)0x0;
    puVar1 = (pointer)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  aad.m_size = (size_t)puVar1;
  aad.m_data = puVar2;
  SendPacket(this,version_data,aad,vers_ignore);
  this->m_sent_aad = true;
  return;
}

Assistant:

void SendVersion(Span<const uint8_t> version_data = {}, bool vers_ignore = false)
    {
        Span<const std::uint8_t> aad;
        // Set AAD to garbage only for first packet.
        if (!m_sent_aad) aad = m_sent_garbage;
        SendPacket(/*content=*/version_data, /*aad=*/aad, /*ignore=*/vers_ignore);
        m_sent_aad = true;
    }